

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  int iVar3;
  uint uVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  ImGuiID IVar11;
  value_type_conflict5 *pvVar12;
  uint uVar13;
  ImVec2 *pIVar14;
  float *pfVar15;
  long lVar16;
  ImRect *pIVar17;
  ImGuiContext *g;
  long lVar18;
  float fVar19;
  ImVec2 IVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ImVec2 local_58;
  float local_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar7 = GImGui;
  pIVar14 = &local_58;
  pIVar5 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_0016f7d9;
  piVar1 = &(pIVar5->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | (pIVar5->DC).NavLayerCurrentMask;
  IVar11 = pIVar7->NavId;
  if ((((IVar11 != id) && (pIVar7->NavAnyRequest != true)) ||
      (pIVar6 = pIVar7->NavWindow, pIVar6->RootWindowForNav != pIVar5->RootWindowForNav)) ||
     ((pIVar5 != pIVar6 && (((uint)(pIVar6->Flags | pIVar5->Flags) >> 0x17 & 1) == 0))))
  goto LAB_0016f7d9;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar13 = (pIVar5->DC).ItemFlags;
  fVar21 = (pIVar5->Pos).x;
  fVar30 = (nav_bb_arg->Min).x - fVar21;
  fVar23 = (pIVar5->Pos).y;
  fVar31 = (nav_bb_arg->Min).y - fVar23;
  fVar21 = (nav_bb_arg->Max).x - fVar21;
  fVar23 = (nav_bb_arg->Max).y - fVar23;
  if ((pIVar7->NavInitRequest == true) && (pIVar7->NavLayer == (pIVar5->DC).NavLayerCurrent)) {
    if ((uVar13 & 0x10) == 0) {
      pIVar7->NavInitResultId = id;
      (pIVar7->NavInitResultRectRel).Min.x = fVar30;
      (pIVar7->NavInitResultRectRel).Min.y = fVar31;
      (pIVar7->NavInitResultRectRel).Max.x = fVar21;
      (pIVar7->NavInitResultRectRel).Max.y = fVar23;
      pIVar7->NavInitRequest = false;
      local_48 = fVar30;
      fStack_44 = fVar31;
      fStack_40 = fVar21;
      fStack_3c = fVar23;
      NavUpdateAnyRequestFlag();
      IVar11 = pIVar7->NavId;
      fVar30 = local_48;
      fVar31 = fStack_44;
      fVar21 = fStack_40;
      fVar23 = fStack_3c;
    }
    else if (pIVar7->NavInitResultId == 0) {
      pIVar7->NavInitResultId = id;
      (pIVar7->NavInitResultRectRel).Min.x = fVar30;
      (pIVar7->NavInitResultRectRel).Min.y = fVar31;
      (pIVar7->NavInitResultRectRel).Max.x = fVar21;
      (pIVar7->NavInitResultRectRel).Max.y = fVar23;
    }
  }
  pIVar8 = GImGui;
  if ((IVar11 != id) && ((uVar13 & 8) == 0)) {
    lVar18 = 0x1b30;
    if (pIVar7->NavWindow == pIVar5) {
      lVar18 = 0x1b00;
    }
    if (pIVar7->NavMoveRequest == true) {
      local_50 = (nav_bb_arg->Min).x;
      fStack_4c = (nav_bb_arg->Min).y;
      local_58 = nav_bb_arg->Max;
      pIVar6 = GImGui->CurrentWindow;
      iVar3 = GImGui->NavLayer;
      if (iVar3 == (pIVar6->DC).NavLayerCurrent) {
        GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
        if ((uint)pIVar8->NavMoveClipDir < 2) {
          IVar20.y = local_58.y;
          IVar20.x = IVar20.y;
          pIVar14 = (ImVec2 *)&local_58.y;
          pfVar15 = &fStack_4c;
          lVar16 = 0xc;
          pIVar17 = (ImRect *)&(pIVar6->ClipRect).Min.y;
          fVar22 = fStack_4c;
        }
        else {
          pfVar15 = &local_50;
          lVar16 = 8;
          pIVar17 = &pIVar6->ClipRect;
          IVar20 = local_58;
          fVar22 = local_50;
        }
        fVar19 = (pIVar17->Min).x;
        fVar24 = *(float *)((long)&(pIVar6->ClipRect).Min.x + lVar16);
        fVar27 = fVar24;
        if (fVar22 <= fVar24) {
          fVar27 = fVar22;
        }
        *pfVar15 = (float)(-(uint)(fVar22 < fVar19) & (uint)fVar19 |
                          ~-(uint)(fVar22 < fVar19) & (uint)fVar27);
        fVar22 = IVar20.x;
        if (fVar22 <= fVar24) {
          fVar24 = fVar22;
        }
        *(uint *)pIVar14 =
             -(uint)(fVar22 < fVar19) & (uint)fVar19 | ~-(uint)(fVar22 < fVar19) & (uint)fVar24;
        fVar22 = (pIVar8->NavScoringRectScreen).Min.x;
        fVar19 = (pIVar8->NavScoringRectScreen).Max.x;
        if (fVar22 <= local_58.x) {
          fVar24 = 0.0;
          if (fVar19 < local_50) {
            fVar24 = local_50 - fVar19;
          }
        }
        else {
          fVar24 = local_58.x - fVar22;
        }
        fVar27 = (pIVar8->NavScoringRectScreen).Min.y;
        fVar28 = (pIVar8->NavScoringRectScreen).Max.y;
        fVar29 = fVar28 - fVar27;
        fVar25 = (local_58.y - fStack_4c) * 0.8 + fStack_4c;
        fVar26 = fVar29 * 0.2 + fVar27;
        if (fVar26 <= fVar25) {
          fVar25 = (local_58.y - fStack_4c) * 0.2 + fStack_4c;
          fVar26 = fVar29 * 0.8 + fVar27;
          if (fVar26 < fVar25) {
            fVar25 = fVar25 - fVar26;
            goto LAB_0016fa96;
          }
          fVar25 = 0.0;
          bVar9 = false;
        }
        else {
          fVar25 = fVar25 - fVar26;
LAB_0016fa96:
          bVar9 = fVar25 != 0.0;
          if (((fVar24 != 0.0) || (NAN(fVar24))) && ((fVar25 != 0.0 || (NAN(fVar25))))) {
            fVar24 = fVar24 / 1000.0 + *(float *)(&DAT_001cbd20 + (ulong)(0.0 < fVar24) * 4);
            bVar9 = true;
          }
        }
        fVar19 = (local_50 + local_58.x) - (fVar22 + fVar19);
        fVar22 = (fStack_4c + local_58.y) - (fVar27 + fVar28);
        fVar27 = ABS(fVar25) + ABS(fVar24);
        fVar28 = ABS(fVar19) + ABS(fVar22);
        if (bVar9) {
LAB_0016fb60:
          fVar26 = fVar27;
          uVar13 = (uint)(0.0 < fVar24);
          fVar22 = fVar25;
          fVar19 = fVar24;
          if (ABS(fVar24) <= ABS(fVar25)) {
            uVar13 = 0.0 < fVar25 | 2;
          }
        }
        else {
          if ((fVar24 != 0.0) || (NAN(fVar24))) goto LAB_0016fb60;
          if ((((fVar19 != 0.0) || (NAN(fVar19))) || (fVar22 != 0.0)) || (NAN(fVar22))) {
            fVar26 = fVar28;
            uVar13 = 0.0 < fVar22 | 2;
            if (ABS(fVar22) < ABS(fVar19)) {
              uVar13 = (uint)(0.0 < fVar19);
            }
          }
          else {
            fVar26 = 0.0;
            uVar13 = (uint)(pIVar8->NavId <= (pIVar6->DC).LastItemId);
            fVar22 = 0.0;
            fVar19 = 0.0;
          }
        }
        uVar4 = pIVar8->NavMoveDir;
        fVar29 = *(float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x2c);
        if (uVar13 != uVar4) goto LAB_0016fc10;
        if (fVar29 <= fVar27) {
          if ((fVar27 != fVar29) || (NAN(fVar27) || NAN(fVar29))) {
LAB_0016fc10:
            bVar9 = false;
          }
          else {
            fVar27 = *(float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x28);
            if (fVar27 <= fVar28) {
              if ((fVar28 == fVar27) && (!NAN(fVar28) && !NAN(fVar27))) {
                if ((uVar13 & 2) == 0) {
                  fVar25 = fVar24;
                }
                if (fVar25 < 0.0) goto LAB_0016fc0b;
              }
              goto LAB_0016fc10;
            }
            *(float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x28) = fVar28;
LAB_0016fc0b:
            bVar9 = true;
          }
          if (((((fVar29 != 3.4028235e+38) || (NAN(fVar29))) || (iVar3 != 1)) ||
              ((*(float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x24) <= fVar26 ||
               ((pIVar8->NavWindow->Flags & 0x10000000) != 0)))) ||
             ((((0.0 <= fVar19 || uVar4 != 0 && (fVar19 <= 0.0 || uVar4 != 1)) &&
               ((uVar4 != 2 || (0.0 <= fVar22)))) && ((uVar4 != 3 || (fVar22 <= 0.0)))))) {
            if (!bVar9) goto LAB_0016fcbb;
          }
          else {
            *(float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x24) = fVar26;
          }
        }
        else {
          *(ulong *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x2c) = CONCAT44(fVar28,fVar27);
        }
        *(ImGuiID *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x3c) = id;
        local_48 = fVar30;
        fStack_44 = fVar31;
        fStack_40 = fVar21;
        fStack_3c = fVar23;
        pvVar12 = ImVector<unsigned_int>::back(&pIVar5->IDStack);
        *(value_type_conflict5 *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x38) = *pvVar12;
        *(ImGuiWindow **)((long)(pIVar7->IO).KeyMap + lVar18 + -0x34) = pIVar5;
        pfVar15 = (float *)((long)(pIVar7->IO).KeyMap + lVar18 + -0x20);
        *pfVar15 = local_48;
        pfVar15[1] = fStack_44;
        pfVar15[2] = fStack_40;
        pfVar15[3] = fStack_3c;
        IVar11 = pIVar7->NavId;
        fVar30 = local_48;
        fVar31 = fStack_44;
        fVar21 = fStack_40;
        fVar23 = fStack_3c;
      }
    }
  }
LAB_0016fcbb:
  if (IVar11 == id) {
    pIVar7->NavWindow = pIVar5;
    iVar3 = (pIVar5->DC).NavLayerCurrent;
    pIVar7->NavLayer = iVar3;
    pIVar7->NavIdIsAlive = true;
    pIVar7->NavIdTabCounter = pIVar5->FocusIdxTabCounter;
    pIVar17 = pIVar5->NavRectRel + iVar3;
    (pIVar17->Min).x = fVar30;
    (pIVar17->Min).y = fVar31;
    (pIVar17->Max).x = fVar21;
    (pIVar17->Max).y = fVar23;
  }
LAB_0016f7d9:
  (pIVar5->DC).LastItemId = id;
  IVar20 = bb->Max;
  (pIVar5->DC).LastItemRect.Min = bb->Min;
  (pIVar5->DC).LastItemRect.Max = IVar20;
  (pIVar5->DC).LastItemStatusFlags = 0;
  bVar9 = IsClippedEx(bb,id,false);
  if ((!bVar9) && (bVar10 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar10)) {
    pIVar2 = &(pIVar5->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar9;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = 0;

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}